

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

float __thiscall CUI::DoScrollbarV(CUI *this,void *pID,CUIRect *pRect,float Current)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  float fVar3;
  float fVar4;
  CUIRect Handle;
  CUIRect Rail;
  vec4 local_68;
  CUIRect local_50;
  CUIRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  fVar4 = 1.0;
  if (Current <= 1.0) {
    fVar4 = Current;
  }
  fVar4 = (float)(~-(uint)(Current < 0.0) & (uint)fVar4);
  CUIRect::VMargin(pRect,5.0,&local_40);
  fVar3 = local_40.h / 3.0;
  if (33.0 <= local_40.h / 3.0) {
    fVar3 = 33.0;
  }
  CUIRect::HSplitTop(&local_40,
                     (float)(-(uint)(33.0 < local_40.w) & (uint)local_40.w |
                            ~-(uint)(33.0 < local_40.w) & (uint)fVar3),&local_50,(CUIRect *)0x0);
  local_50.y = (local_40.h - local_50.h) * fVar4 + local_50.y;
  bVar1 = MouseHovered(this,&local_50);
  bVar2 = MouseHovered(this,&local_40);
  if (this->m_pActiveItem == pID) {
    this->m_ActiveItemValid = true;
    bVar2 = true;
    if ((this->m_MouseButtons & 1) != 0) goto LAB_0018b82a;
    this->m_pActiveItem = (void *)0x0;
LAB_0018b7fe:
    bVar2 = false;
  }
  else {
    if (this->m_pHotItem == pID) {
      if ((this->m_MouseButtons & 1) == 0) goto LAB_0018b7fe;
      DoScrollbarV::s_OffsetY = this->m_MouseY - local_50.y;
    }
    else {
      if ((((~bVar2 | (byte)this->m_LastMouseButtons) & 1) != 0 || bVar1) ||
          (this->m_MouseButtons & 1) == 0) goto LAB_0018b7fe;
      DoScrollbarV::s_OffsetY = local_50.h * 0.5;
    }
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pID;
    bVar2 = true;
    if (pID != (void *)0x0) {
      this->m_pLastActiveItem = pID;
    }
  }
LAB_0018b82a:
  if (bVar1) {
    this->m_pBecommingHotItem = pID;
  }
  if (bVar2) {
    fVar3 = ((this->m_MouseY - DoScrollbarV::s_OffsetY) - local_40.y) / (local_40.h - local_50.h);
    fVar4 = 1.0;
    if (fVar3 <= 1.0) {
      fVar4 = fVar3;
    }
    fVar4 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar4);
  }
  local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  CUIRect::Draw(&local_40,&local_68,local_40.w * 0.5,0xf);
  local_68.field_0.x = 1.0;
  local_68.field_1.y = 1.0;
  if (!bVar1) {
    local_68.field_0.x = 0.8;
    local_68.field_1.y = 0.8;
  }
  if (bVar2) {
    local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f666666;
    local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f666666;
  }
  local_68.field_3.w = 1.0;
  local_68.field_2.z = local_68.field_0.x;
  CUIRect::Draw(&local_50,&local_68,local_50.w * 0.5,0xf);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return fVar4;
}

Assistant:

float CUI::DoScrollbarV(const void *pID, const CUIRect *pRect, float Current)
{
	Current = clamp(Current, 0.0f, 1.0f);

	// layout
	CUIRect Rail;
	pRect->VMargin(5.0f, &Rail);

	CUIRect Handle;
	Rail.HSplitTop(clamp(33.0f, Rail.w, Rail.h / 3.0f), &Handle, 0);
	Handle.y += (Rail.h - Handle.h) * Current;

	// logic
	static float s_OffsetY;
	const bool InsideHandle = MouseHovered(&Handle);
	const bool InsideRail = MouseHovered(&Rail);
	bool Grabbed = false; // whether to apply the offset

	if(CheckActiveItem(pID))
	{
		if(MouseButton(0))
			Grabbed = true;
		else
			SetActiveItem(0);
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(0))
		{
			s_OffsetY = MouseY() - Handle.y;
			SetActiveItem(pID);
			Grabbed = true;
		}
	}
	else if(MouseButtonClicked(0) && !InsideHandle && InsideRail)
	{
		s_OffsetY = Handle.h / 2.0f;
		SetActiveItem(pID);
		Grabbed = true;
	}

	if(InsideHandle)
	{
		SetHotItem(pID);
	}

	float ReturnValue = Current;
	if(Grabbed)
	{
		const float Min = Rail.y;
		const float Max = Rail.h - Handle.h;
		const float Cur = MouseY() - s_OffsetY;
		ReturnValue = clamp((Cur - Min) / Max, 0.0f, 1.0f);
	}

	// render
	Rail.Draw(vec4(1.0f, 1.0f, 1.0f, 0.25f), Rail.w / 2.0f);
	Handle.Draw(ScrollBarColorFunction.GetColor(Grabbed, InsideHandle), Handle.w / 2.0f);

	return ReturnValue;
}